

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O1

String * kj::operator*(String *__return_storage_ptr__,long param_2)

{
  String *pSVar1;
  char *pcVar2;
  ArrayDisposer *pAVar3;
  ArrayPtr<void_*const> trace;
  size_t sVar4;
  uint uVar5;
  kj *pkVar6;
  long lVar7;
  code *delim;
  ulong uVar8;
  ulong elementCount;
  kj *this;
  bool bVar9;
  char (*params_5) [2];
  String *in_stack_ffffffffffffff18;
  size_t sStack_e0;
  ArrayDisposer *local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  Array<kj::String> contextText;
  String local_a8;
  String local_88;
  void **in_stack_ffffffffffffff90;
  StringPtr local_58;
  String local_48;
  
  uVar5 = 0;
  for (lVar7 = *(long *)(param_2 + 0x48); lVar7 != 0; lVar7 = *(long *)(lVar7 + 0x30)) {
    uVar5 = uVar5 + 1;
  }
  elementCount = (ulong)uVar5;
  delim = _::HeapArrayDisposer::Allocate_<kj::String,_false,_false>::construct;
  params_5 = (char (*) [2])0x344b1f;
  contextText.ptr =
       (String *)
       _::HeapArrayDisposer::allocateImpl
                 (0x18,elementCount,elementCount,
                  _::HeapArrayDisposer::Allocate_<kj::String,_false,_false>::construct,
                  _::HeapArrayDisposer::Allocate_<kj::String,_false,_false>::destruct);
  contextText.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  uVar8 = 0;
  this = *(kj **)(param_2 + 0x48);
  contextText.size_ = elementCount;
  do {
    pkVar6 = this;
    if (this != (kj *)0x0) {
      str<char_const*const&,char_const(&)[2],int_const&,char_const(&)[12],kj::String_const&,char_const(&)[2]>
                ((String *)&stack0xffffffffffffff18,this,(char **)0x3c8cf5,(char (*) [2])(this + 8),
                 (int *)": context: ",(char (*) [12])(this + 0x10),(String *)0x3ba451,params_5);
      pSVar1 = contextText.ptr + uVar8;
      pcVar2 = (pSVar1->content).ptr;
      delim = (code *)contextText.ptr;
      if (pcVar2 != (char *)0x0) {
        delim = (code *)(pSVar1->content).size_;
        pAVar3 = (pSVar1->content).disposer;
        (pSVar1->content).ptr = (char *)0x0;
        (pSVar1->content).size_ = 0;
        params_5 = (char (*) [2])0x344bbc;
        (**pAVar3->_vptr_ArrayDisposer)(pAVar3,pcVar2,1,delim,delim,0);
      }
      uVar8 = (ulong)((int)uVar8 + 1);
      (pSVar1->content).ptr = (char *)in_stack_ffffffffffffff18;
      (pSVar1->content).size_ = sStack_e0;
      (pSVar1->content).disposer = local_d8;
      pkVar6 = *(kj **)(this + 0x30);
    }
    bVar9 = this != (kj *)0x0;
    this = pkVar6;
  } while (bVar9);
  strArray<kj::Array<kj::String>&>
            ((String *)&stack0xffffffffffffff18,(kj *)&contextText,(Array<kj::String> *)0x385fb3,
             (char *)delim);
  local_48.content.ptr = *(char **)(param_2 + 0x18);
  local_cc = *(undefined4 *)(param_2 + 0x20);
  local_d0 = *(undefined4 *)(param_2 + 0x24);
  pAVar3 = *(ArrayDisposer **)(param_2 + 0x30);
  local_48.content.size_ = 0x385fb3;
  if (pAVar3 != (ArrayDisposer *)0x0) {
    local_48.content.size_ = *(undefined8 *)(param_2 + 0x28);
  }
  local_48.content.disposer = (ArrayDisposer *)0x1;
  if ((ArrayDisposer *)0x1 < pAVar3) {
    local_48.content.disposer = pAVar3;
  }
  local_58.content.size_ = 0x3ca2d4;
  if ((ArrayDisposer *)0x1 >= pAVar3) {
    local_58.content.size_ = 0x385fb3;
  }
  local_a8.content.ptr = (char *)(param_2 + 0x50);
  local_a8.content.size_ = (size_t)*(uint *)(param_2 + 0x150);
  local_58.content.ptr = "\nstack: ";
  if (local_a8.content.size_ == 0) {
    local_58.content.ptr = "";
  }
  strArray<kj::ArrayPtr<void*const>&>
            (&local_88,(kj *)&local_a8,(ArrayPtr<void_*const> *)0x3ca046,local_58.content.ptr);
  trace.size_ = (size_t)__return_storage_ptr__;
  trace.ptr = in_stack_ffffffffffffff90;
  stringifyStackTrace(trace);
  str<kj::String,char_const*,char_const(&)[2],int,char_const(&)[3],kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::String,kj::String>
            (__return_storage_ptr__,(kj *)&stack0xffffffffffffff18,&local_48,(char **)0x3c8cf5,
             (char (*) [2])&local_cc,(int *)0x3ca2d4,(char (*) [3])&local_d0,
             (Type *)&local_58.content.size_,(char **)&local_48.content.size_,&local_58,
             (char **)&local_88,&local_a8,in_stack_ffffffffffffff18);
  sVar4 = local_a8.content.size_;
  pcVar2 = local_a8.content.ptr;
  if (local_a8.content.ptr != (char *)0x0) {
    local_a8.content.ptr = (char *)0x0;
    local_a8.content.size_ = 0;
    (**(local_a8.content.disposer)->_vptr_ArrayDisposer)
              (local_a8.content.disposer,pcVar2,1,sVar4,sVar4,0);
  }
  sVar4 = local_88.content.size_;
  pcVar2 = local_88.content.ptr;
  if (local_88.content.ptr != (char *)0x0) {
    local_88.content.ptr = (char *)0x0;
    local_88.content.size_ = 0;
    (**(local_88.content.disposer)->_vptr_ArrayDisposer)
              (local_88.content.disposer,pcVar2,1,sVar4,sVar4,0);
  }
  if (in_stack_ffffffffffffff18 != (String *)0x0) {
    (**local_d8->_vptr_ArrayDisposer)(local_d8,in_stack_ffffffffffffff18,1,sStack_e0,sStack_e0,0);
  }
  sVar4 = contextText.size_;
  pSVar1 = contextText.ptr;
  if (contextText.ptr != (String *)0x0) {
    contextText.ptr = (String *)0x0;
    contextText.size_ = 0;
    (**(contextText.disposer)->_vptr_ArrayDisposer)
              (contextText.disposer,pSVar1,0x18,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return __return_storage_ptr__;
}

Assistant:

String KJ_STRINGIFY(const Exception& e) {
  uint contextDepth = 0;

  Maybe<const Exception::Context&> contextPtr = e.getContext();
  for (;;) {
    KJ_IF_MAYBE(c, contextPtr) {
      ++contextDepth;
      contextPtr = c->next;
    } else {
      break;
    }
  }